

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall TimerNode::TimerNode(TimerNode *this,TimerNode *tn)

{
  this->expiredTime_ = 0;
  std::__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>,
             &(tn->SPHttpData).super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

TimerNode::TimerNode(TimerNode &tn)
    : SPHttpData(tn.SPHttpData), expiredTime_(0) {}